

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QAbstractItemModelPrivate::Change>::reallocateAndGrow
          (QArrayDataPointer<QAbstractItemModelPrivate::Change> *this,GrowthPosition where,
          qsizetype n,QArrayDataPointer<QAbstractItemModelPrivate::Change> *old)

{
  long lVar1;
  bool bVar2;
  Change *pCVar3;
  QGenericArrayOps<QAbstractItemModelPrivate::Change> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<QAbstractItemModelPrivate::Change> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QAbstractItemModelPrivate::Change> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  Change *in_stack_ffffffffffffff70;
  Change *in_stack_ffffffffffffff78;
  QGenericArrayOps<QAbstractItemModelPrivate::Change> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QAbstractItemModelPrivate::Change> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)
                           in_stack_ffffffffffffff70), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)&DAT_aaaaaaaaaaaaaaaa,
                 (qsizetype)n_00,in_ESI);
    if ((0 < in_RDX) &&
       (pCVar3 = data((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)
                      &stack0xffffffffffffffe0), pCVar3 == (Change *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_00823316;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)
                          in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QAbstractItemModelPrivate::Change> *)
                  operator->((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)
                             &stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)0x823227);
        begin((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)0x823236);
        QtPrivate::QGenericArrayOps<QAbstractItemModelPrivate::Change>::copyAppend
                  (this_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (Change *)
             operator->((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)
                        &stack0xffffffffffffffe0);
        pCVar3 = begin((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)0x82326f);
        begin((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)0x82327e);
        QtPrivate::QGenericArrayOps<QAbstractItemModelPrivate::Change>::moveAppend
                  (in_stack_ffffffffffffff80,pCVar3,in_stack_ffffffffffffff70);
      }
    }
    swap((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)in_stack_ffffffffffffff70,
         (QArrayDataPointer<QAbstractItemModelPrivate::Change> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)in_stack_ffffffffffffff70,
           (QArrayDataPointer<QAbstractItemModelPrivate::Change> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)
                       in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity
              ((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)in_stack_ffffffffffffff70);
    freeSpaceAtEnd((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)in_stack_ffffffffffffff78
                  );
    QtPrivate::QMovableArrayOps<QAbstractItemModelPrivate::Change>::reallocate
              ((QMovableArrayOps<QAbstractItemModelPrivate::Change> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00823316:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }